

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lfunc.c
# Opt level: O0

void poptbclist(lua_State *L)

{
  bool bVar1;
  StkId local_18;
  StkId tbc;
  lua_State *L_local;
  
  local_18 = (L->tbclist).p + -(long)(int)(uint)(((L->tbclist).p)->tbclist).delta;
  while( true ) {
    bVar1 = false;
    if ((L->stack).p < local_18) {
      bVar1 = (local_18->tbclist).delta == 0;
    }
    if (!bVar1) break;
    local_18 = local_18 + -0xffff;
  }
  (L->tbclist).p = local_18;
  return;
}

Assistant:

static void poptbclist (lua_State *L) {
  StkId tbc = L->tbclist.p;
  lua_assert(tbc->tbclist.delta > 0);  /* first element cannot be dummy */
  tbc -= tbc->tbclist.delta;
  while (tbc > L->stack.p && tbc->tbclist.delta == 0)
    tbc -= MAXDELTA;  /* remove dummy nodes */
  L->tbclist.p = tbc;
}